

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_library.cpp
# Opt level: O2

void __thiscall Omega_h::Library::~Library(Library *this)

{
  Real total_runtime;
  History *pHVar1;
  I32 IVar2;
  Now b;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (profile::global_singleton_history != (History *)0x0) {
    b = now();
    total_runtime = operator-(b,(Now)(profile::global_singleton_history->start_time).impl.__d.__r);
    IVar2 = Comm::rank((this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (IVar2 == 0) {
      profile::print_top_down_and_bottom_up(profile::global_singleton_history,total_runtime);
    }
    profile::print_top_sorted(profile::global_singleton_history,total_runtime);
    pHVar1 = profile::global_singleton_history;
    if (profile::global_singleton_history != (History *)0x0) {
      profile::History::~History(profile::global_singleton_history);
    }
    operator_delete(pHVar1,0x70);
    profile::global_singleton_history = (History *)0x0;
  }
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>,&local_28
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>,&local_28)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  disable_pooling();
  if (max_memory_stacktrace != (void *)0x0) {
    operator_delete__(max_memory_stacktrace);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&(this->timers)._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->world_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->argv_);
  return;
}

Assistant:

Library::~Library() {
  if (Omega_h::profile::global_singleton_history) {
    double total_runtime = now() - Omega_h::profile::global_singleton_history->start_time;
    if (world_->rank() == 0) {
      // FIXME - parallelize?
      Omega_h::profile::print_top_down_and_bottom_up(
          *Omega_h::profile::global_singleton_history, total_runtime);
    }
    Omega_h::profile::print_top_sorted(
          *Omega_h::profile::global_singleton_history, total_runtime);
    delete Omega_h::profile::global_singleton_history;
    Omega_h::profile::global_singleton_history = nullptr;
  }
  // need to destroy all Comm objects prior to MPI_Finalize()
  world_ = CommPtr();
  self_ = CommPtr();
  disable_pooling();
#ifdef OMEGA_H_USE_KOKKOS
  if (we_called_kokkos_init) {
    Kokkos::finalize();
    we_called_kokkos_init = false;
  }
#endif
#ifdef OMEGA_H_USE_MPI
  if (we_called_mpi_init) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Finalize());
    we_called_mpi_init = false;
  }
#endif
  delete[] Omega_h::max_memory_stacktrace;
}